

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

double GetCostFixed(uint litlen,uint dist,void *unused)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  uint in_EDI;
  int cost;
  int lsym;
  int lbits;
  int dbits;
  undefined4 local_28;
  undefined8 local_8;
  
  if (in_ESI == 0) {
    if (in_EDI < 0x90) {
      local_8 = 8.0;
    }
    else {
      local_8 = 9.0;
    }
  }
  else {
    iVar1 = ZopfliGetDistExtraBits(in_ESI);
    iVar2 = ZopfliGetLengthExtraBits(in_EDI);
    iVar3 = ZopfliGetLengthSymbol(in_EDI);
    if (iVar3 < 0x118) {
      local_28 = 7;
    }
    else {
      local_28 = 8;
    }
    local_8 = (double)(local_28 + 5 + iVar1 + iVar2);
  }
  return local_8;
}

Assistant:

static double GetCostFixed(unsigned litlen, unsigned dist, void* unused) {
  (void)unused;
  if (dist == 0) {
    if (litlen <= 143) return 8;
    else return 9;
  } else {
    int dbits = ZopfliGetDistExtraBits(dist);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int lsym = ZopfliGetLengthSymbol(litlen);
    int cost = 0;
    if (lsym <= 279) cost += 7;
    else cost += 8;
    cost += 5;  /* Every dist symbol has length 5. */
    return cost + dbits + lbits;
  }
}